

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  TextReader<fmt::Locale> *pTVar2;
  char *pcVar3;
  int iVar4;
  CountExpr CVar5;
  NumberOfArgHandler args;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
LAB_00456da6:
    pTVar2 = this->reader_;
    pcVar3 = (pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = pcVar3;
    (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    goto LAB_00456dc4;
  case PLTERM:
    iVar4 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    pTVar2 = this->reader_;
    if (iVar4 < 2) {
      local_38 = 0;
      uStack_30 = 0;
      local_20.types_ = 0;
      local_20.field_1.values_ = (Value *)&local_38;
      TextReader<fmt::Locale>::DoReportError
                (pTVar2,(pTVar2->super_ReaderBase).token_,(CStringRef)0x4b97f7,&local_20);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    }
    else {
      TextReader<fmt::Locale>::ReadTillEndOfLine(pTVar2);
      iVar4 = iVar4 + -1;
      do {
        pTVar2 = this->reader_;
        pcVar3 = (pTVar2->super_ReaderBase).ptr_;
        (pTVar2->super_ReaderBase).token_ = pcVar3;
        (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
        ReadConstant(this,*pcVar3);
        pTVar2 = this->reader_;
        pcVar3 = (pTVar2->super_ReaderBase).ptr_;
        (pTVar2->super_ReaderBase).token_ = pcVar3;
        (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
        ReadConstant(this,*pcVar3);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pTVar2 = this->reader_;
    pcVar3 = (pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = pcVar3;
    (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
    ReadConstant(this,*pcVar3);
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_00456d5f_caseD_29:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x4b981f,&local_20
              );
    break;
  case FIRST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    if (0 < iVar4) {
      do {
        pTVar2 = this->reader_;
        pcVar3 = (pTVar2->super_ReaderBase).ptr_;
        (pTVar2->super_ReaderBase).token_ = pcVar3;
        (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    break;
  case SUM:
    iVar4 = ReadNumArgs(this,3);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    if (0 < iVar4) {
      do {
        pTVar2 = this->reader_;
        pcVar3 = (pTVar2->super_ReaderBase).ptr_;
        (pTVar2->super_ReaderBase).token_ = pcVar3;
        (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    break;
  case LAST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    pTVar2 = this->reader_;
    pcVar3 = (pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = pcVar3;
    (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
                *)this,iVar4 + -1,(ArgHandler *)&local_38);
    break;
  case NUMBEROF_SYM:
    iVar4 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadSymbolicExpr(this);
    if (1 < iVar4) {
      iVar4 = iVar4 + -1;
      do {
        ReadSymbolicExpr(this);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    break;
  case COUNT:
    CVar5 = ReadCountExpr(this);
    return (NumericExpr)CVar5.super_ExprBase.impl_;
  default:
    if (KVar1 == ADD) goto LAB_00456da6;
    if (KVar1 != FIRST_UNARY) goto switchD_00456d5f_caseD_29;
LAB_00456dc4:
    pTVar2 = this->reader_;
    pcVar3 = (pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = pcVar3;
    (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
  }
  return (NumericExpr)(Impl *)0x0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}